

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

ostream * operator<<(ostream *stream,Variable *obj)

{
  Type *pTVar1;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  pTVar1 = LiteScript::Object::GetType(obj->obj);
  (*pTVar1->_vptr_Type[0x25])(&local_38,pTVar1,obj);
  std::__ostream_insert<char,std::char_traits<char>>(stream,local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const LiteScript::Variable& obj) {
    stream << (std::string)(obj);
    return stream;
}